

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O2

Type QtPromise::resolve<float_const&>(float *value)

{
  QSharedData *pQVar1;
  PromiseData<float> *this;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<float>_> extraout_RDX;
  Type TVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<float>::Data> local_58;
  PromiseResolver<float> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<float>::Data> local_48;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<float>::Data> local_40;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<float>::Data> local_38;
  QPromiseBase<float> local_30;
  
  *(undefined ***)value = &PTR__QPromiseBase_0012d7f0;
  this = (PromiseData<float> *)operator_new(0x68);
  (this->super_PromiseDataBase<float,_void_(const_float_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(this->super_PromiseDataBase<float,_void_(const_float_&)>).super_QSharedData = 0;
  *(undefined8 *)&(this->super_PromiseDataBase<float,_void_(const_float_&)>).m_lock = 0;
  *(undefined8 *)&(this->super_PromiseDataBase<float,_void_(const_float_&)>).m_settled = 0;
  (this->super_PromiseDataBase<float,_void_(const_float_&)>).m_handlers.d.d = (Data *)0x0;
  (this->super_PromiseDataBase<float,_void_(const_float_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_> *)0x0;
  (this->super_PromiseDataBase<float,_void_(const_float_&)>).m_handlers.d.size = 0;
  (this->super_PromiseDataBase<float,_void_(const_float_&)>).m_catchers.d.d = (Data *)0x0;
  (this->super_PromiseDataBase<float,_void_(const_float_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this->super_PromiseDataBase<float,_void_(const_float_&)>).m_catchers.d.size = 0;
  (this->super_PromiseDataBase<float,_void_(const_float_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this->m_value).m_data.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_value).m_data.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<float>::PromiseData(this);
  *(PromiseData<float> **)(value + 2) = this;
  LOCK();
  pQVar1 = &(this->super_PromiseDataBase<float,_void_(const_float_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_30.m_d.d = *(PromiseData<float> **)(value + 2);
  if (local_30.m_d.d != (PromiseData<float> *)0x0) {
    LOCK();
    pQVar1 = &((local_30.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_30._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012db48;
  QtPromisePrivate::PromiseResolver<float>::PromiseResolver(&resolver,(QPromise<float> *)&local_30);
  QPromiseBase<float>::~QPromiseBase(&local_30);
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<float>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_40.d = (Data *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    local_38.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_38 = resolver.m_d.d;
  }
  local_48.d = (Data *)0x0;
  local_58 = resolver.m_d.d;
  QtPromisePrivate::PromiseResolver<float>::resolve<float_const&>
            ((PromiseResolver<float> *)&local_58,(float *)&(anonymous_namespace)::kRes);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<float>::Data>::
  ~QExplicitlySharedDataPointer(&local_38);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<float>::Data>::
  ~QExplicitlySharedDataPointer(&local_48);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<float>::Data>::
  ~QExplicitlySharedDataPointer(&local_58);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<float>::Data>::
  ~QExplicitlySharedDataPointer(&local_40);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<float>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  *(undefined ***)value = &PTR__QPromiseBase_0012db48;
  TVar2.super_QPromiseBase<float>.m_d.d = extraout_RDX.d;
  TVar2.super_QPromiseBase<float>._vptr_QPromiseBase = (_func_int **)value;
  return (Type)TVar2.super_QPromiseBase<float>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseDeduce<T>::Type resolve(T&& value)
{
    using namespace QtPromisePrivate;
    using PromiseType = typename PromiseDeduce<T>::Type;
    using ValueType = typename PromiseType::Type;
    using ResolveType = QPromiseResolve<ValueType>;
    using RejectType = QPromiseReject<ValueType>;

    return PromiseType{[&](ResolveType&& resolve, RejectType&& reject) {
        PromiseFulfill<Unqualified<T>>::call(std::forward<T>(value),
                                             std::forward<ResolveType>(resolve),
                                             std::forward<RejectType>(reject));
    }};
}